

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTools.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Assimp::trim_whitespaces<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Assimp *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  char cVar1;
  long lVar2;
  
  while ((lVar2 = *(long *)(this + 8), lVar2 != 0 &&
         ((**(char **)this == ' ' || (**(char **)this == '\t'))))) {
    std::__cxx11::string::erase((ulong)this,0);
  }
  while ((lVar2 != 0 &&
         ((cVar1 = *(char *)(*(long *)this + -1 + lVar2), cVar1 == ' ' || (cVar1 == '\t'))))) {
    std::__cxx11::string::erase((ulong)this,lVar2 - 1);
    lVar2 = *(long *)(this + 8);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string_type trim_whitespaces(string_type str)
{
    while (!str.empty() && IsSpace(str[0])) str.erase(0);
    while (!str.empty() && IsSpace(str[str.length() - 1])) str.erase(str.length() - 1);
    return str;
}